

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

void * Curl_node_take_elem(Curl_llist_node *e)

{
  Curl_llist *pCVar1;
  Curl_llist *list;
  void *ptr;
  Curl_llist_node *e_local;
  
  if (e == (Curl_llist_node *)0x0) {
    e_local = (Curl_llist_node *)0x0;
  }
  else {
    pCVar1 = e->_list;
    if (pCVar1 != (Curl_llist *)0x0) {
      if (e == pCVar1->_head) {
        pCVar1->_head = e->_next;
        if (pCVar1->_head == (Curl_llist_node *)0x0) {
          pCVar1->_tail = (Curl_llist_node *)0x0;
        }
        else {
          e->_next->_prev = (Curl_llist_node *)0x0;
        }
      }
      else {
        if (e->_prev != (Curl_llist_node *)0x0) {
          e->_prev->_next = e->_next;
        }
        if (e->_next == (Curl_llist_node *)0x0) {
          pCVar1->_tail = e->_prev;
        }
        else {
          e->_next->_prev = e->_prev;
        }
      }
      pCVar1->_size = pCVar1->_size - 1;
    }
    e_local = (Curl_llist_node *)e->_ptr;
    e->_list = (Curl_llist *)0x0;
    e->_ptr = (void *)0x0;
    e->_prev = (Curl_llist_node *)0x0;
    e->_next = (Curl_llist_node *)0x0;
  }
  return e_local;
}

Assistant:

void *Curl_node_take_elem(struct Curl_llist_node *e)
{
  void *ptr;
  struct Curl_llist *list;
  if(!e)
    return NULL;

  list = e->_list;
  DEBUGASSERT(list);
  DEBUGASSERT(list->_init == LLISTINIT);
  DEBUGASSERT(list->_size);
  DEBUGASSERT(e->_init == NODEINIT);
  if(list) {
    if(e == list->_head) {
      list->_head = e->_next;

      if(!list->_head)
        list->_tail = NULL;
      else
        e->_next->_prev = NULL;
    }
    else {
      if(e->_prev)
        e->_prev->_next = e->_next;

      if(!e->_next)
        list->_tail = e->_prev;
      else
        e->_next->_prev = e->_prev;
    }
    --list->_size;
  }
  ptr = e->_ptr;

  e->_list = NULL;
  e->_ptr  = NULL;
  e->_prev = NULL;
  e->_next = NULL;
#ifdef DEBUGBUILD
  e->_init = NODEREM; /* specific pattern on remove - not zero */
#endif

  return ptr;
}